

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool ScanValue(ConfigScanner *sc)

{
  char cVar1;
  _Bool _Var2;
  char *pcVar3;
  long in_RDI;
  char *value;
  char ch;
  undefined7 in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  if (in_RDI == 0) {
    return false;
  }
  cVar1 = **(char **)(in_RDI + 0x18);
  if (cVar1 == '\"') {
    *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
    pcVar3 = GetQuote(sc);
    if (pcVar3 == (char *)0x0) {
      return false;
    }
    *(char **)(in_RDI + 0x58) = pcVar3;
    *(undefined4 *)(in_RDI + 0x38) = 1;
  }
  else if ((cVar1 == 't') || (cVar1 == 'f')) {
    _Var2 = ScanBoolean((ConfigScanner *)CONCAT17(cVar1,in_stack_ffffffffffffffe8));
    if (!_Var2) {
      return false;
    }
  }
  else {
    if (((cVar1 != '+') && (cVar1 != '-')) && ((cVar1 < '0' || ('9' < cVar1)))) {
      return false;
    }
    _Var2 = ScanNumber((ConfigScanner *)
                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    if (!_Var2) {
      return false;
    }
  }
  return true;
}

Assistant:

bool ScanValue(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return false;
	}
	char ch = *sc->ptr;
	if (ch == '"')
	{
		sc->ptr++;
		char *value = GetQuote(sc);
		if (value == NULL)
		{
			return false;
		}
		sc->current_string = value;
		sc->vtype = VTYPE_STRING;
	}
	else if (ch == 't' || ch == 'f')
	{
		if (!ScanBoolean(sc))
		{
			return false;
		}
	}
	else if (ch == '+' || ch == '-' || (ch >= '0' && ch <= '9'))
	{
		if (!ScanNumber(sc))
		{
			return false;
		}
	}
	else
	{
		return false;
	}
	return true;
}